

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJSONHelpers.cxx
# Opt level: O0

bool anon_unknown.dwarf_7f1d8::testVectorFilter(void)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  bool bVar1;
  ostream *poVar2;
  Value *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_310;
  allocator<char> local_2e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  iterator local_2c0;
  size_type local_2b8;
  undefined1 local_2aa;
  allocator<char> local_2a9 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  iterator local_280;
  size_type local_278;
  Value local_270;
  undefined1 local_242;
  allocator<char> local_241;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  iterator local_218;
  size_type local_210;
  Value local_208;
  undefined4 local_1e0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1dc;
  undefined1 local_1db;
  allocator<char> local_1da;
  allocator<char> local_1d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  string local_1b0 [32];
  iterator local_190;
  size_type local_188;
  undefined1 local_180 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expected;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  iterator local_138;
  size_type local_130;
  undefined1 local_128 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  l;
  Value local_e8;
  Value local_b0;
  undefined1 local_88 [8];
  cmJSONState state;
  Value v;
  
  Json::Value::Value((Value *)((long)&state.doc.field_2 + 8),arrayValue);
  cmJSONState::cmJSONState((cmJSONState *)local_88);
  Json::Value::Value(&local_b0,"Hello");
  Json::Value::append((Value *)((long)&state.doc.field_2 + 8),&local_b0);
  Json::Value::~Value(&local_b0);
  Json::Value::Value(&local_e8,"world!");
  Json::Value::append((Value *)((long)&state.doc.field_2 + 8),&local_e8);
  Json::Value::~Value(&local_e8);
  Json::Value::Value((Value *)&l.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,"ignore");
  Json::Value::append((Value *)((long)&state.doc.field_2 + 8),
                      (Value *)&l.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Json::Value::~Value((Value *)&l.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"default",
             (allocator<char> *)
             ((long)&expected.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  local_138 = &local_158;
  local_130 = 1;
  this = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)((long)&expected.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(this);
  __l_03._M_len = local_130;
  __l_03._M_array = local_138;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_128,__l_03,this);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&expected.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  local_310 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_138;
  do {
    local_310 = local_310 + -1;
    std::__cxx11::string::~string((string *)local_310);
  } while (local_310 != &local_158);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&expected.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_1db = 1;
  local_1d8 = &local_1d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"Hello",&local_1d9);
  local_1d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1b0,"world!",&local_1da);
  local_1db = 0;
  local_190 = &local_1d0;
  local_188 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_1dc);
  __l_02._M_len = local_188;
  __l_02._M_array = local_190;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_180,__l_02,&local_1dc);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_1dc);
  local_350 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_190;
  do {
    local_350 = local_350 + -1;
    std::__cxx11::string::~string((string *)local_350);
  } while (local_350 != &local_1d0);
  std::allocator<char>::~allocator(&local_1da);
  std::allocator<char>::~allocator(&local_1d9);
  bVar1 = std::
          function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
          ::operator()((function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                        *)(anonymous_namespace)::StringVectorFilterHelper_abi_cxx11_,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_128,(Value *)((long)&state.doc.field_2 + 8),(cmJSONState *)local_88)
  ;
  if (bVar1) {
    bVar1 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_128,
                            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_180);
    if (bVar1) {
      Json::Value::Value(&local_208,2);
      this_00 = Json::Value::operator[]((Value *)((long)&state.doc.field_2 + 8),1);
      Json::Value::operator=(this_00,&local_208);
      Json::Value::~Value(&local_208);
      local_242 = 1;
      local_240 = &local_238;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"default",&local_241);
      local_242 = 0;
      local_218 = &local_238;
      local_210 = 1;
      __l_01._M_len = 1;
      __l_01._M_array = local_218;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_128,__l_01);
      local_408 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_218;
      do {
        local_408 = local_408 + -1;
        std::__cxx11::string::~string((string *)local_408);
      } while (local_408 != &local_238);
      std::allocator<char>::~allocator(&local_241);
      bVar1 = std::
              function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
              ::operator()((function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                            *)(anonymous_namespace)::StringVectorFilterHelper_abi_cxx11_,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_128,(Value *)((long)&state.doc.field_2 + 8),
                           (cmJSONState *)local_88);
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "ASSERT_TRUE(!StringVectorFilterHelper(l, &v, &state)) failed on line "
                                );
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x16f);
        std::operator<<(poVar2,"\n");
        v.limit_._7_1_ = false;
      }
      else {
        Json::Value::Value(&local_270,"Hello");
        Json::Value::operator=((Value *)((long)&state.doc.field_2 + 8),&local_270);
        Json::Value::~Value(&local_270);
        local_2aa = '\x01';
        local_2a9._1_8_ = &local_2a0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"default",local_2a9)
        ;
        local_2aa = '\0';
        local_280 = &local_2a0;
        local_278 = 1;
        __l_00._M_len = 1;
        __l_00._M_array = local_280;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_128,__l_00);
        local_478 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_280;
        do {
          local_478 = local_478 + -1;
          std::__cxx11::string::~string((string *)local_478);
        } while (local_478 != &local_2a0);
        std::allocator<char>::~allocator(local_2a9);
        bVar1 = std::
                function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                ::operator()((function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                              *)(anonymous_namespace)::StringVectorFilterHelper_abi_cxx11_,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_128,(Value *)((long)&state.doc.field_2 + 8),
                             (cmJSONState *)local_88);
        if (bVar1) {
          poVar2 = std::operator<<((ostream *)&std::cout,
                                   "ASSERT_TRUE(!StringVectorFilterHelper(l, &v, &state)) failed on line "
                                  );
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x173);
          std::operator<<(poVar2,"\n");
          v.limit_._7_1_ = false;
        }
        else {
          local_2e8 = &local_2e0;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2e0,"default",&local_2e9);
          local_2c0 = &local_2e0;
          local_2b8 = 1;
          __l._M_len = 1;
          __l._M_array = local_2c0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_128,__l);
          local_4e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_2c0;
          do {
            local_4e0 = local_4e0 + -1;
            std::__cxx11::string::~string((string *)local_4e0);
          } while (local_4e0 != &local_2e0);
          std::allocator<char>::~allocator(&local_2e9);
          bVar1 = std::
                  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                  ::operator()((function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                                *)(anonymous_namespace)::StringVectorFilterHelper_abi_cxx11_,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_128,(Value *)0x0,(cmJSONState *)local_88);
          if (bVar1) {
            bVar1 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_128);
            if (bVar1) {
              v.limit_._7_1_ = true;
            }
            else {
              poVar2 = std::operator<<((ostream *)&std::cout,
                                       "ASSERT_TRUE(l.empty()) failed on line ");
              poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x177);
              std::operator<<(poVar2,"\n");
              v.limit_._7_1_ = false;
            }
          }
          else {
            poVar2 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(StringVectorFilterHelper(l, nullptr, &state)) failed on line "
                                    );
            poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x176);
            std::operator<<(poVar2,"\n");
            v.limit_._7_1_ = false;
          }
        }
      }
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(l == expected) failed on line ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x16b);
      std::operator<<(poVar2,"\n");
      v.limit_._7_1_ = false;
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "ASSERT_TRUE(StringVectorFilterHelper(l, &v, &state)) failed on line ")
    ;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x16a);
    std::operator<<(poVar2,"\n");
    v.limit_._7_1_ = false;
  }
  local_1e0 = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_180);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_128);
  cmJSONState::~cmJSONState((cmJSONState *)local_88);
  Json::Value::~Value((Value *)((long)&state.doc.field_2 + 8));
  return v.limit_._7_1_;
}

Assistant:

bool testVectorFilter()
{
  Json::Value v(Json::arrayValue);
  cmJSONState state;
  v.append("Hello");
  v.append("world!");
  v.append("ignore");

  std::vector<std::string> l{ "default" };
  std::vector<std::string> expected{
    "Hello",
    "world!",
  };
  ASSERT_TRUE(StringVectorFilterHelper(l, &v, &state));
  ASSERT_TRUE(l == expected);

  v[1] = 2;
  l = { "default" };
  ASSERT_TRUE(!StringVectorFilterHelper(l, &v, &state));

  v = "Hello";
  l = { "default" };
  ASSERT_TRUE(!StringVectorFilterHelper(l, &v, &state));

  l = { "default" };
  ASSERT_TRUE(StringVectorFilterHelper(l, nullptr, &state));
  ASSERT_TRUE(l.empty());

  return true;
}